

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  bool bVar1;
  Status local_70;
  Status local_68;
  Status local_60;
  Status local_58 [3];
  undefined1 local_39;
  long *local_38;
  WritableFile *file;
  string *psStack_28;
  bool should_sync_local;
  string *fname_local;
  Slice *data_local;
  Env *env_local;
  Status *s;
  
  local_39 = 0;
  file._7_1_ = should_sync;
  psStack_28 = fname;
  fname_local = (string *)data;
  data_local = (Slice *)env;
  env_local = (Env *)this;
  (*env->_vptr_Env[4])(this,env,fname,&local_38);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    (**(code **)(*local_38 + 0x10))(local_58,local_38,fname_local);
    Status::operator=((Status *)this,local_58);
    Status::~Status(local_58);
    bVar1 = Status::ok((Status *)this);
    if ((bVar1) && ((file._7_1_ & 1) != 0)) {
      (**(code **)(*local_38 + 0x28))(&local_60);
      Status::operator=((Status *)this,&local_60);
      Status::~Status(&local_60);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (**(code **)(*local_38 + 0x18))(&local_68);
      Status::operator=((Status *)this,&local_68);
      Status::~Status(&local_68);
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) {
      (**(code **)(data_local->data_ + 0x40))(&local_70,data_local,psStack_28);
      Status::~Status(&local_70);
    }
  }
  return (Status)(char *)this;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}